

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::PausableReadAsyncIoStream::tryReadImpl
          (PausableReadAsyncIoStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  NullableValue<kj::Exception> _e1576;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_4e0;
  undefined1 local_4d8 [8];
  anon_union_16_1_a8c68091_for_NullableValue<kj::Function<void_()>_>_2 local_4d0 [25];
  Deferred<kj::Function<void_()>_> local_338 [16];
  NullableValue<kj::Exception> local_1a8;
  
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
  (**(code **)(**(long **)((long)buffer + 0x18) + 8))(local_4d8);
  trackRead(local_338,(PausableReadAsyncIoStream *)buffer);
  Promise<unsigned_long>::attach<kj::_::Deferred<kj::Function<void()>>>
            ((Promise<unsigned_long> *)&local_4e0,(Deferred<kj::Function<void_()>_> *)local_4d8);
  kj::_::Deferred<kj::Function<void_()>_>::~Deferred(local_338);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_4d8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,&local_4e0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_4e0);
  local_4d0[0]._0_1_ = 0;
  kj::_::NullableValue<kj::Exception>::NullableValue
            (&local_1a8,(NullableValue<kj::Exception> *)(local_4d8 + 8));
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)(local_4d8 + 8));
  if (local_1a8.isSet == true) {
    Promise<unsigned_long>::Promise
              ((Promise<unsigned_long> *)(local_4d8 + 8),&local_1a8.field_1.value);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_4d8 + 8));
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_4d8 + 8));
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1a8);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<size_t> PausableReadAsyncIoStream::tryReadImpl(
    void* buffer, size_t minBytes, size_t maxBytes) {
  // Hack: evalNow used here because `newAdaptedPromise` has a bug. We may need to change
  // `PromiseDisposer::alloc` to not be `noexcept` but in order to do so we'll need to benchmark
  // its performance.
  return kj::evalNow([&]() -> kj::Promise<size_t> {
    return inner->tryRead(buffer, minBytes, maxBytes).attach(trackRead());
  });
}